

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> * __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::readImage
          (MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
           *__return_storage_ptr__,CopiesAndBlittingTestInstance *this,VkImage image,
          ImageParms *parms)

{
  bool bVar1;
  TextureLevel *this_00;
  ulong uVar2;
  ulong uVar3;
  TextureFormat imageFormat;
  TextureLevel depthTexture;
  TextureFormat local_d8;
  TextureLevel local_d0;
  PixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  local_d8 = ::vk::mapVkFormat(parms->format);
  this_00 = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel
            (this_00,&local_d8,(parms->extent).width,(parms->extent).height,(parms->extent).depth);
  (__return_storage_ptr__->
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>).m_data.ptr = this_00;
  bVar1 = tcu::isCombinedDepthStencilType(local_d8.type);
  if (!bVar1) {
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&local_d0,
               (__return_storage_ptr__->
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>).m_data.
               ptr);
    readImageAspect(this,image,(PixelBufferAccess *)&local_d0,parms);
    return __return_storage_ptr__;
  }
  bVar1 = tcu::hasDepthComponent(local_d8.order);
  if (!bVar1) goto LAB_004694c1;
  if (local_d8.type == FLOAT_UNSIGNED_INT_24_8_REV) {
    uVar2 = 0x2300000000;
LAB_0046941c:
    uVar3 = 0x12;
  }
  else {
    if (local_d8.type == UNSIGNED_INT_24_8_REV) {
      uVar2 = 0x1a00000000;
      goto LAB_0046941c;
    }
    if (local_d8.type == UNSIGNED_INT_16_8_8) {
      uVar2 = 0x400000000;
      goto LAB_0046941c;
    }
    uVar2 = 0x2600000000;
    uVar3 = 0x15;
  }
  local_a8.super_ConstPixelBufferAccess.m_format = (TextureFormat)(uVar3 | uVar2);
  tcu::TextureLevel::TextureLevel
            (&local_d0,(TextureFormat *)&local_a8,(parms->extent).width,(parms->extent).height,
             (parms->extent).depth);
  tcu::TextureLevel::getAccess(&local_a8,&local_d0);
  readImageAspect(this,image,&local_a8,parms);
  tcu::TextureLevel::getAccess
            (&local_58,
             (__return_storage_ptr__->
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>).m_data.ptr
            );
  tcu::getEffectiveDepthStencilAccess(&local_a8,&local_58,MODE_DEPTH);
  tcu::TextureLevel::getAccess(&local_80,&local_d0);
  tcu::copy((EVP_PKEY_CTX *)&local_a8,(EVP_PKEY_CTX *)&local_80);
  tcu::TextureLevel::~TextureLevel(&local_d0);
LAB_004694c1:
  bVar1 = tcu::hasStencilComponent(local_d8.order);
  if (bVar1) {
    local_a8.super_ConstPixelBufferAccess.m_format =
         tcu::getEffectiveDepthStencilTextureFormat(&local_d8,MODE_STENCIL);
    tcu::TextureLevel::TextureLevel
              (&local_d0,(TextureFormat *)&local_a8,(parms->extent).width,(parms->extent).height,
               (parms->extent).depth);
    tcu::TextureLevel::getAccess(&local_a8,&local_d0);
    readImageAspect(this,image,&local_a8,parms);
    tcu::TextureLevel::getAccess
              (&local_58,
               (__return_storage_ptr__->
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>).m_data.
               ptr);
    tcu::getEffectiveDepthStencilAccess(&local_a8,&local_58,MODE_STENCIL);
    tcu::TextureLevel::getAccess(&local_80,&local_d0);
    tcu::copy((EVP_PKEY_CTX *)&local_a8,(EVP_PKEY_CTX *)&local_80);
    tcu::TextureLevel::~TextureLevel(&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<tcu::TextureLevel> CopiesAndBlittingTestInstance::readImage	(vk::VkImage		image,
																		 const ImageParms&	parms)
{
	const tcu::TextureFormat		imageFormat	= mapVkFormat(parms.format);
	de::MovePtr<tcu::TextureLevel>	resultLevel	(new tcu::TextureLevel(imageFormat, parms.extent.width, parms.extent.height, parms.extent.depth));

	if (tcu::isCombinedDepthStencilType(imageFormat.type))
	{
		if (tcu::hasDepthComponent(imageFormat.order))
		{
			tcu::TextureLevel	depthTexture	(mapCombinedToDepthTransferFormat(imageFormat), parms.extent.width, parms.extent.height, parms.extent.depth);
			readImageAspect(image, depthTexture.getAccess(), parms);
			tcu::copy(tcu::getEffectiveDepthStencilAccess(resultLevel->getAccess(), tcu::Sampler::MODE_DEPTH), depthTexture.getAccess());
		}

		if (tcu::hasStencilComponent(imageFormat.order))
		{
			tcu::TextureLevel	stencilTexture	(tcu::getEffectiveDepthStencilTextureFormat(imageFormat, tcu::Sampler::MODE_STENCIL), parms.extent.width, parms.extent.height, parms.extent.depth);
			readImageAspect(image, stencilTexture.getAccess(), parms);
			tcu::copy(tcu::getEffectiveDepthStencilAccess(resultLevel->getAccess(), tcu::Sampler::MODE_STENCIL), stencilTexture.getAccess());
		}
	}
	else
		readImageAspect(image, resultLevel->getAccess(), parms);

	return resultLevel;
}